

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test::
~TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test
          (TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test *this)

{
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test *mem;
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}